

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O1

void Nwk_ObjDeleteFanin(Nwk_Obj_t *pObj,Nwk_Obj_t *pFanin)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  
  iVar1 = pObj->nFanins;
  uVar3 = pObj->nFanouts + iVar1;
  if (uVar3 == 0 || SCARRY4(pObj->nFanouts,iVar1) != (int)uVar3 < 0) {
    uVar4 = 0;
    iVar5 = 1;
  }
  else {
    uVar4 = 0;
    bVar2 = false;
    iVar5 = 0;
    do {
      if ((bVar2) || (pObj->pFanio[uVar4] != pFanin)) {
        lVar6 = (long)iVar5;
        iVar5 = iVar5 + 1;
        pObj->pFanio[lVar6] = pObj->pFanio[uVar4];
      }
      else {
        bVar2 = true;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    iVar5 = iVar5 + 1;
  }
  if ((int)uVar4 != iVar5) {
    __assert_fail("i == k + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFanio.c"
                  ,0xcb,"void Nwk_ObjDeleteFanin(Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  pObj->nFanins = iVar1 + -1;
  uVar3 = pFanin->nFanins;
  iVar1 = pFanin->nFanouts;
  if (iVar1 < 1) {
    uVar4 = (ulong)uVar3;
  }
  else {
    uVar4 = (ulong)(int)uVar3;
    iVar5 = iVar1 + uVar3;
    bVar2 = false;
    do {
      if ((bVar2) || (pFanin->pFanio[uVar4] != pObj)) {
        lVar6 = (long)(int)uVar3;
        uVar3 = uVar3 + 1;
        pFanin->pFanio[lVar6] = pFanin->pFanio[uVar4];
      }
      else {
        bVar2 = true;
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)iVar5);
  }
  if ((int)uVar4 != uVar3 + 1) {
    __assert_fail("i == k + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFanio.c"
                  ,0xd5,"void Nwk_ObjDeleteFanin(Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  pFanin->nFanouts = iVar1 + -1;
  return;
}

Assistant:

void Nwk_ObjDeleteFanin( Nwk_Obj_t * pObj, Nwk_Obj_t * pFanin )
{
    int i, k, Limit, fFound;
    // remove pFanin from the fanin list of pObj
    Limit = pObj->nFanins + pObj->nFanouts;
    fFound = 0;
    for ( k = i = 0; i < Limit; i++ )
        if ( fFound || pObj->pFanio[i] != pFanin )
            pObj->pFanio[k++] = pObj->pFanio[i];
        else
            fFound = 1;
    assert( i == k + 1 ); // if it fails, likely because of duplicated fanin
    pObj->nFanins--;
    // remove pObj from the fanout list of pFanin
    Limit = pFanin->nFanins + pFanin->nFanouts;
    fFound = 0;
    for ( k = i = pFanin->nFanins; i < Limit; i++ )
        if ( fFound || pFanin->pFanio[i] != pObj )
            pFanin->pFanio[k++] = pFanin->pFanio[i];
        else
            fFound = 1;
    assert( i == k + 1 ); // if it fails, likely because of duplicated fanout
    pFanin->nFanouts--; 
}